

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::TagAliasRegistry::add
          (TagAliasRegistry *this,string *alias,string *tag,SourceLineInfo *lineInfo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong uVar3;
  pointer pcVar4;
  _Alloc_hider _Var5;
  int iVar6;
  ostream *poVar7;
  domain_error *pdVar8;
  bool bVar9;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>_>,_bool>
  pVar10;
  ostringstream oss;
  Colour local_205;
  Colour local_204;
  Colour local_203;
  Colour local_202;
  Colour local_201;
  SourceLineInfo *local_200;
  TagAlias local_1f8;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
  local_1a8 [4];
  
  paVar1 = &local_1a8[0].first.field_2;
  local_200 = lineInfo;
  local_1a8[0].first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"[@","");
  _Var5._M_p = local_1a8[0].first._M_dataplus._M_p;
  uVar3 = alias->_M_string_length;
  if ((uVar3 < local_1a8[0].first._M_string_length) ||
     ((local_1a8[0].first._M_string_length != 0 &&
      (iVar6 = bcmp(local_1a8[0].first._M_dataplus._M_p,(alias->_M_dataplus)._M_p,
                    local_1a8[0].first._M_string_length), iVar6 != 0)))) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p != paVar1) {
      operator_delete(_Var5._M_p);
    }
  }
  else {
    if (uVar3 == 0) {
      bVar9 = false;
    }
    else {
      bVar9 = (alias->_M_dataplus)._M_p[uVar3 - 1] == ']';
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0].first._M_dataplus._M_p != paVar1) {
      operator_delete(local_1a8[0].first._M_dataplus._M_p);
    }
    if (bVar9) {
      local_1b8 = *(undefined4 *)&local_200->file;
      uStack_1b4 = *(undefined4 *)((long)&local_200->file + 4);
      uStack_1b0 = (undefined4)local_200->line;
      uStack_1ac = *(undefined4 *)((long)&local_200->line + 4);
      paVar2 = &local_1f8.tag.field_2;
      pcVar4 = (tag->_M_dataplus)._M_p;
      local_1f8.tag._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1f8,pcVar4,pcVar4 + tag->_M_string_length);
      local_1f8.lineInfo.file = (char *)CONCAT44(uStack_1b4,local_1b8);
      local_1f8.lineInfo.line = CONCAT44(uStack_1ac,uStack_1b0);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagAlias>
      ::pair<Catch::TagAlias,_true>(local_1a8,alias,&local_1f8);
      pVar10 = std::
               _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
               ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::TagAlias>>
                         ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagAlias>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagAlias>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagAlias>>>
                           *)&this->m_registry,local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0].second.tag._M_dataplus._M_p != &local_1a8[0].second.tag.field_2) {
        operator_delete(local_1a8[0].second.tag._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0].first._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8[0].first._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8.tag._M_dataplus._M_p != paVar2) {
        operator_delete(local_1f8.tag._M_dataplus._M_p);
      }
      if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        local_205.m_moved = false;
        Colour::use(Red);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"error: tag alias, \"",0x13);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(alias->_M_dataplus)._M_p,alias->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\" already registered.\n",0x16);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\tFirst seen at ",0xf);
        local_201.m_moved = false;
        Colour::use(Red);
        (*(this->super_ITagAliasRegistry)._vptr_ITagAliasRegistry[2])(&local_1f8,this,alias);
        operator<<(poVar7,(SourceLineInfo *)(local_1f8.tag._M_dataplus._M_p + 0x20));
        local_204.m_moved = true;
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_204.m_moved,1);
        local_202.m_moved = false;
        Colour::use(Red);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\tRedefined at ",0xe);
        local_203.m_moved = false;
        Colour::use(FileName);
        operator<<(poVar7,local_200);
        local_204.m_moved = true;
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_204.m_moved,1);
        Colour::~Colour(&local_203);
        Colour::~Colour(&local_202);
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_1f8.tag._M_dataplus._M_p !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0) &&
           (*(char **)local_1f8.tag._M_dataplus._M_p != local_1f8.tag._M_dataplus._M_p + 0x10)) {
          operator_delete(*(char **)local_1f8.tag._M_dataplus._M_p);
        }
        Colour::~Colour(&local_201);
        Colour::~Colour(&local_205);
        pdVar8 = (domain_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::domain_error::domain_error(pdVar8,local_1f8.tag._M_dataplus._M_p);
        __cxa_throw(pdVar8,&std::domain_error::typeinfo,std::domain_error::~domain_error);
      }
      return;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_204.m_moved = false;
  Colour::use(Red);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"error: tag alias, \"",0x13);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,(alias->_M_dataplus)._M_p,alias->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,"\" is not of the form [@alias name].\n",0x24);
  local_205.m_moved = false;
  Colour::use(FileName);
  operator<<(poVar7,local_200);
  local_1f8.tag._M_dataplus._M_p._0_1_ = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_1f8,1);
  Colour::~Colour(&local_205);
  Colour::~Colour(&local_204);
  pdVar8 = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::domain_error::domain_error(pdVar8,local_1f8.tag._M_dataplus._M_p);
  __cxa_throw(pdVar8,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

void TagAliasRegistry::add( std::string const& alias, std::string const& tag, SourceLineInfo const& lineInfo ) {

        if( !startsWith( alias, "[@" ) || !endsWith( alias, ']' ) ) {
            std::ostringstream oss;
            oss << Colour( Colour::Red )
                << "error: tag alias, \"" << alias << "\" is not of the form [@alias name].\n"
                << Colour( Colour::FileName )
                << lineInfo << '\n';
            throw std::domain_error( oss.str().c_str() );
        }
        if( !m_registry.insert( std::make_pair( alias, TagAlias( tag, lineInfo ) ) ).second ) {
            std::ostringstream oss;
            oss << Colour( Colour::Red )
                << "error: tag alias, \"" << alias << "\" already registered.\n"
                << "\tFirst seen at "
                << Colour( Colour::Red ) << find(alias)->lineInfo << '\n'
                << Colour( Colour::Red ) << "\tRedefined at "
                << Colour( Colour::FileName) << lineInfo << '\n';
            throw std::domain_error( oss.str().c_str() );
        }
    }